

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

Gia_Man_t *
Gia_ManSweepWithBoxesAndDomains
          (Gia_Man_t *p,void *pParsS,int fConst,int fEquiv,int fVerbose,int fVerbEquivs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Man_t *pGVar6;
  int nFlops;
  int nFlopsNew;
  int pFlopTypes [3];
  int iDom;
  int *pReprs;
  int nDoms;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *pClp;
  int fVerbEquivs_local;
  int fVerbose_local;
  int fEquiv_local;
  int fConst_local;
  void *pParsS_local;
  Gia_Man_t *p_local;
  
  iVar2 = Vec_IntFindMax(p->vRegClasses);
  memset(&nFlops,0,0xc);
  iVar3 = Gia_ManRegNum(p);
  if (iVar3 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSweep.c"
                  ,0x28d,
                  "Gia_Man_t *Gia_ManSweepWithBoxesAndDomains(Gia_Man_t *, void *, int, int, int, int)"
                 );
  }
  if (p->pAigExtra == (Gia_Man_t *)0x0) {
    __assert_fail("p->pAigExtra != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSweep.c"
                  ,0x28e,
                  "Gia_Man_t *Gia_ManSweepWithBoxesAndDomains(Gia_Man_t *, void *, int, int, int, int)"
                 );
  }
  if (iVar2 < 2) {
    __assert_fail("nDoms > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSweep.c"
                  ,0x28f,
                  "Gia_Man_t *Gia_ManSweepWithBoxesAndDomains(Gia_Man_t *, void *, int, int, int, int)"
                 );
  }
  pTemp = Gia_ManDupUnnormalize(p);
  if (pTemp == (Gia_Man_t *)0x0) {
    p_local = (Gia_Man_t *)0x0;
  }
  else {
    Gia_ManTransferTiming(pTemp,p);
    for (pFlopTypes[1] = 1; pFlopTypes[1] <= iVar2; pFlopTypes[1] = pFlopTypes[1] + 1) {
      uVar4 = Vec_IntCountEntry(pTemp->vRegClasses,pFlopTypes[1]);
      if (1 < (int)uVar4) {
        pGVar6 = Gia_ManDupCollapse(pTemp,pTemp->pAigExtra,(Vec_Int_t *)0x0,1);
        Gia_ManSweepComputeOneDomainEquivs
                  (pGVar6,pTemp->vRegClasses,pFlopTypes[1],pParsS,fConst,fEquiv,fVerbose);
        register0x00000000 = Gia_ManFraigSelectReprs(pTemp,pGVar6,fVerbose,&nFlops);
        Gia_ManStop(pGVar6);
        Gia_ManTransferTiming(p,pTemp);
        pGVar6 = Gia_ManFraigReduceGia(pTemp,stack0xffffffffffffffa8);
        Gia_ManTransferTiming(pGVar6,p);
        Gia_ManStop(pTemp);
        if (stack0xffffffffffffffa8 != (int *)0x0) {
          free(stack0xffffffffffffffa8);
          stack0xffffffffffffffa8 = (int *)0x0;
        }
        pTemp = Gia_ManDupWithBoxes(pGVar6,1);
        Gia_ManStop(pGVar6);
        uVar5 = Vec_IntCountEntry(pTemp->vRegClasses,pFlopTypes[1]);
        pFlopTypes[0] = (uVar4 - uVar5) - (nFlops + nFlopsNew);
        if (fVerbEquivs != 0) {
          printf("Domain %2d : %5d -> %5d :  ",(ulong)(uint)pFlopTypes[1],(ulong)uVar4,(ulong)uVar5)
          ;
          iVar1 = nFlopsNew;
          iVar3 = nFlops;
          uVar4 = Abc_MaxInt(0,pFlopTypes[0]);
          uVar5 = Abc_MaxInt(0,-pFlopTypes[0]);
          printf("EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n",(ulong)(uint)iVar3,
                 (ulong)(uint)iVar1,(ulong)uVar4,(ulong)uVar5);
        }
      }
    }
    p_local = Gia_ManDupNormalize(pTemp,0);
    Gia_ManTransferTiming(p_local,pTemp);
    Gia_ManStop(pTemp);
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManSweepWithBoxesAndDomains( Gia_Man_t * p, void * pParsS, int fConst, int fEquiv, int fVerbose, int fVerbEquivs )
{ 
    Gia_Man_t * pClp, * pNew, * pTemp;
    int nDoms = Vec_IntFindMax(p->vRegClasses);
    int * pReprs, iDom, pFlopTypes[3] = {0};
    assert( Gia_ManRegNum(p) == 0 );
    assert( p->pAigExtra != NULL );
    assert( nDoms > 1 );
    // order AIG objects
    pNew = Gia_ManDupUnnormalize( p );
    if ( pNew == NULL )
        return NULL;
    Gia_ManTransferTiming( pNew, p );
    // iterate over domains
    for ( iDom = 1; iDom <= nDoms; iDom++ )
    {
        int nFlopsNew, nFlops = Vec_IntCountEntry(pNew->vRegClasses, iDom);
        if ( nFlops < 2 )
            continue;
        // find global equivalences
        pClp = Gia_ManDupCollapse( pNew, pNew->pAigExtra, NULL, 1 );
        //Gia_DumpAiger( pClp, p->pSpec, iDom, 2 );
        //Gia_ManPrintStats( pClp, NULL );
        // compute equivalences
        Gia_ManSweepComputeOneDomainEquivs( pClp, pNew->vRegClasses, iDom, pParsS, fConst, fEquiv, fVerbose );
        // transfer equivalences
        pReprs = Gia_ManFraigSelectReprs( pNew, pClp, fVerbose, pFlopTypes );
        Gia_ManStop( pClp );
        // reduce AIG
        Gia_ManTransferTiming( p, pNew );
        pNew = Gia_ManFraigReduceGia( pTemp = pNew, pReprs );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( pTemp );
        ABC_FREE( pReprs );
        // derive new AIG
        pNew = Gia_ManDupWithBoxes( pTemp = pNew, 1 );
        Gia_ManStop( pTemp );
        // report
        nFlopsNew = Vec_IntCountEntry(pNew->vRegClasses, iDom);
        pFlopTypes[2] = nFlops - nFlopsNew - (pFlopTypes[0] + pFlopTypes[1]);
        if ( fVerbEquivs )
        {
            printf( "Domain %2d : %5d -> %5d :  ", iDom, nFlops, nFlopsNew );
            printf( "EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n", 
                pFlopTypes[0], pFlopTypes[1], Abc_MaxInt(0, pFlopTypes[2]), Abc_MaxInt(0, -pFlopTypes[2]) );
            //Gia_ManPrintStats( pNew, NULL );
        }
    }
    // normalize the result
    pNew = Gia_ManDupNormalize( pTemp = pNew, 0 );
    Gia_ManTransferTiming( pNew, pTemp );
    Gia_ManStop( pTemp );
    // check integrity
    //Gia_ManCheckIntegrityWithBoxes( pNew );
    return pNew;
}